

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
::write(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
        *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  format_specs *spec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  size_t __n_00;
  ssize_t extraout_RAX;
  ssize_t sVar4;
  void *pvVar5;
  format_error *this_00;
  char *data;
  undefined4 in_register_00000034;
  char *__s;
  str_writer<char> local_30;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  if (__s == (char *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __n_00 = strlen(__s);
  spec = this->specs_;
  if (spec == (format_specs *)0x0) {
    pbVar2 = (this->writer_).out_.container;
    sVar3 = pbVar2->_M_string_length;
    sVar4 = std::__cxx11::string::resize((ulong)pbVar2,(char)sVar3 + (char)__n_00);
    if (__n_00 != 0) {
      pvVar5 = memmove((pbVar2->_M_dataplus)._M_p + sVar3,__s,__n_00);
      return (ssize_t)pvVar5;
    }
  }
  else {
    uVar1 = (spec->super_core_format_specs).precision;
    local_30.size_ = (ulong)uVar1;
    if (__n_00 <= uVar1) {
      local_30.size_ = __n_00;
    }
    if ((int)uVar1 < 0) {
      local_30.size_ = __n_00;
    }
    local_30.s = __s;
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
                *)this,&spec->super_align_spec,&local_30);
    sVar4 = extraout_RAX;
  }
  return sVar4;
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    basic_string_view<char_type> sv(value, length);
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }